

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AlphaVectorPruning.cpp
# Opt level: O2

bool AlphaVectorPruning::FindBelief
               (AlphaVector *p,ValueFunctionPOMDPDiscrete *uU,
               vector<double,_std::allocator<double>_> *belief,size_t acceleratedPruningThreshold)

{
  long lVar1;
  ulong uVar2;
  const_reference pvVar3;
  vector<double,_std::allocator<double>_> *extraout_RDX;
  uint i;
  double dVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  
  if (acceleratedPruningThreshold != 0) {
    lVar1 = (long)(uU->super__Vector_base<AlphaVector,_std::allocator<AlphaVector>_>)._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)(uU->super__Vector_base<AlphaVector,_std::allocator<AlphaVector>_>)._M_impl.
                  super__Vector_impl_data._M_start;
    uU = (ValueFunctionPOMDPDiscrete *)0x28;
    belief = (vector<double,_std::allocator<double>_> *)(lVar1 % 0x28);
    if (acceleratedPruningThreshold <= (ulong)(lVar1 / 0x28)) goto LAB_0041b0f3;
  }
  FindBeliefNormal(p,uU,belief);
  belief = extraout_RDX;
LAB_0041b0f3:
  FindBeliefAccelerated(p,uU,belief);
  auVar5 = ZEXT816(0) << 0x40;
  i = 0;
  while (uVar2 = (ulong)((long)(p->_m_values).super__Vector_base<double,_std::allocator<double>_>.
                               _M_impl.super__Vector_impl_data._M_finish -
                        (long)(p->_m_values).super__Vector_base<double,_std::allocator<double>_>.
                              _M_impl.super__Vector_impl_data._M_start) >> 3, i != (uint)uVar2) {
    auVar6._0_8_ = auVar5._0_8_;
    dVar4 = AlphaVector::GetValue(p,i);
    pvVar3 = std::vector<double,_std::allocator<double>_>::at
                       ((vector<double,_std::allocator<double>_> *)uU,(ulong)i);
    auVar6._8_8_ = 0;
    auVar7._8_8_ = 0;
    auVar7._0_8_ = dVar4;
    i = i + 1;
    auVar5._8_8_ = 0;
    auVar5._0_8_ = *pvVar3;
    auVar5 = vfmadd231sd_fma(auVar6,auVar7,auVar5);
  }
  return SUB81(uVar2,0);
}

Assistant:

bool AlphaVectorPruning::FindBelief(const AlphaVector &p,
                                    const ValueFunctionPOMDPDiscrete &uU,
                                    vector<double> &belief,
                                    size_t acceleratedPruningThreshold)
{
    // if the threshold is set to 0, accelerated pruning is disabled
    if(acceleratedPruningThreshold==0 ||
       uU.size() < acceleratedPruningThreshold)
    {
        return FindBeliefNormal(p, uU, belief);
    }
    else
    {
        return FindBeliefAccelerated(p, uU, belief);
    }
}